

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaOf.c
# Opt level: O0

void Of_ManPrintInit(Of_Man_t *p)

{
  uint uVar1;
  int nChoices;
  Of_Man_t *p_local;
  
  if (p->pPars->fVerbose != 0) {
    printf("LutSize = %d  ",(ulong)(uint)p->pPars->nLutSize);
    printf("CutNum = %d  ",(ulong)(uint)p->pPars->nCutNum);
    printf("Iter = %d  ",(ulong)(uint)(p->pPars->nRounds + p->pPars->nRoundsEla));
    printf("Coarse = %d   ",(ulong)(uint)p->pPars->fCoarsen);
    if (p->pPars->fCutMin != 0) {
      uVar1 = Vec_MemEntryNum(p->vTtMem);
      printf("Funcs = %d  ",(ulong)uVar1);
    }
    uVar1 = Gia_ManChoiceNum(p->pGia);
    if (uVar1 != 0) {
      printf("Choices = %d  ",(ulong)uVar1);
    }
    printf("\n");
    printf("Computing cuts...\r");
    fflush(_stdout);
  }
  return;
}

Assistant:

void Of_ManPrintInit( Of_Man_t * p )
{
    int nChoices;
    if ( !p->pPars->fVerbose )
        return;
    printf( "LutSize = %d  ", p->pPars->nLutSize );
    printf( "CutNum = %d  ",  p->pPars->nCutNum );
    printf( "Iter = %d  ",    p->pPars->nRounds + p->pPars->nRoundsEla );
    printf( "Coarse = %d   ", p->pPars->fCoarsen );
    if ( p->pPars->fCutMin )
    printf( "Funcs = %d  ",   Vec_MemEntryNum(p->vTtMem) );
    nChoices = Gia_ManChoiceNum( p->pGia );
    if ( nChoices )
    printf( "Choices = %d  ", nChoices );
    printf( "\n" );
    printf( "Computing cuts...\r" );
    fflush( stdout );
}